

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Accuracy::InterpolationCase::iterate(InterpolationCase *this)

{
  pointer *ppbVar1;
  Precision PVar2;
  RenderContext *pRVar3;
  size_type sVar4;
  TestContext *this_00;
  undefined1 auVar5 [16];
  bool bVar6;
  int i;
  deUint32 dVar7;
  GLuint index;
  GLuint index_00;
  GLint GVar8;
  GLenum err;
  RenderTarget *pRVar9;
  char *__s;
  mapped_type *pmVar10;
  TestError *pTVar11;
  NotSupportedError *this_01;
  uint uVar12;
  uint y;
  char *pcVar13;
  ulong uVar14;
  qpTestResult testResult;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint x;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar28;
  float fVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float in_XMM7_Dc;
  float in_XMM7_Dd;
  float fVar36;
  float fVar37;
  Vec3 scale;
  Vec3 bias;
  Vector<float,_3> res_5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  pointer local_410;
  Vector<float,_3> res_7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  Vector<float,_3> res_4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  float local_3a8;
  float local_3a4;
  undefined4 local_3a0;
  float local_39c;
  Vec3 triB [2];
  Surface rendered;
  float positions [16];
  Surface reference;
  ProgramSources sources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  templateParams;
  Random rnd;
  ShaderProgram program;
  
  local_410 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar7);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar15 = pRVar9->m_width;
  if ((iVar15 < 0x80) || (pRVar9->m_height < 0x80)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport",::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
               ,0xa3);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar7 = deRandom_getUint32(&rnd.m_rnd);
  x = dVar7 % (iVar15 - 0x7fU);
  iVar15 = pRVar9->m_height;
  dVar7 = deRandom_getUint32(&rnd.m_rnd);
  y = dVar7 % (iVar15 - 0x7fU);
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &templateParams._M_t._M_impl.super__Rb_tree_header._M_header;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getPrecisionName(this->m_precision);
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"PRECISION","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&templateParams,(key_type *)&sources);
  pcVar13 = (char *)pmVar10->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar13,(ulong)__s);
  if (sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(sources.sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (int)sources.sources[0].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) + 1);
  }
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  res_5.m_data._0_8_ = &local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&res_5,
             "#version 300 es\nin highp vec4 a_position;\nin ${PRECISION} vec3 a_coords;\nout ${PRECISION} vec3 v_coords;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coords = a_coords;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_3c8,(string *)&res_5);
  tcu::StringTemplate::specialize((string *)positions,(StringTemplate *)local_3c8,&templateParams);
  res_7.m_data._0_8_ = &local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&res_7,
             "#version 300 es\nin ${PRECISION} vec3 v_coords;\nuniform ${PRECISION} vec3 u_scale;\nuniform ${PRECISION} vec3 u_bias;\nlayout(location = 0) out ${PRECISION} vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(v_coords * u_scale + u_bias, 1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)triB,(string *)&res_7);
  tcu::StringTemplate::specialize((string *)&res_4,(StringTemplate *)triB,&templateParams);
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources,(value_type *)positions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources + 1,(value_type *)&res_4);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,&sources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&sources.attribLocationBindings);
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_4.m_data._0_8_ != &local_3d8) {
    operator_delete((void *)res_4.m_data._0_8_,
                    CONCAT44(local_3d8._M_allocated_capacity._4_4_,
                             local_3d8._M_allocated_capacity._0_4_) + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)triB);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_7.m_data._0_8_ != &local_3f8) {
    operator_delete((void *)res_7.m_data._0_8_,
                    CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                             local_3f8._M_allocated_capacity._0_4_) + 1);
  }
  if ((float *)CONCAT44(positions[1],positions[0]) != positions + 4) {
    operator_delete((float *)CONCAT44(positions[1],positions[0]),
                    CONCAT44(positions[5],positions[4]) + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_5.m_data._0_8_ != &local_428) {
    operator_delete((void *)res_5.m_data._0_8_,
                    CONCAT44(local_428._M_allocated_capacity._4_4_,
                             local_428._M_allocated_capacity._0_4_) + 1);
  }
  glu::operator<<((TestLog *)local_410,&program);
  if (program.m_program.m_info.linkOk == false) {
    if ((this->m_precision == PRECISION_HIGHP) &&
       (iVar15 = (*((this->super_TestCase).m_context)->m_contextInfo->_vptr_ContextInfo[7])(),
       (char)iVar15 == '\0')) {
      pcVar13 = "Fragment highp not supported";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      pcVar13 = "Compile failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar13);
LAB_01062ee8:
    glu::ShaderProgram::~ShaderProgram(&program);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&templateParams._M_t);
    return STOP;
  }
  if (this->m_projective == false) {
    fVar35 = 1.0;
    fVar36 = 1.0;
    fVar21 = 1.0;
    positions[0xc] = 1.0;
  }
  else {
    positions[0xc] = 2.0;
    fVar21 = 1.3;
    fVar36 = 0.8;
    fVar35 = 0.6;
  }
  positions[0] = -fVar21;
  positions[1] = -fVar21;
  lVar18 = 0;
  positions[2] = 0.0;
  positions[3] = fVar21;
  positions[4] = -fVar36;
  positions[5] = fVar36;
  positions[6] = 0.0;
  positions[7] = fVar36;
  positions[8] = fVar35;
  positions[9] = -fVar35;
  positions[10] = 0.0;
  positions[0xb] = fVar35;
  positions[0xd] = positions[0xc];
  positions[0xe] = 0.0;
  positions[0xf] = positions[0xc];
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    *(float *)((long)&sources.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4) =
         (this->m_max).m_data[lVar18] - (this->m_min).m_data[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  scale.m_data[2] = 0.0;
  scale.m_data[0] = 0.0;
  scale.m_data[1] = 0.0;
  lVar18 = 0;
  do {
    scale.m_data[lVar18] =
         1.0 / *(float *)((long)&sources.sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lVar18 = 0;
  do {
    *(float *)((long)&sources.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4) =
         -(this->m_min).m_data[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  bias.m_data[2] = 0.0;
  bias.m_data[0] = 0.0;
  bias.m_data[1] = 0.0;
  lVar18 = 0;
  do {
    bias.m_data[lVar18] =
         *(float *)((long)&sources.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4) *
         scale.m_data[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  auVar25._4_4_ = scale.m_data[2];
  auVar25._0_4_ = scale.m_data[1];
  auVar23._4_4_ = scale.m_data[1];
  auVar23._0_4_ = scale.m_data[0];
  auVar34._0_4_ = 0.0 - bias.m_data[0];
  auVar34._4_4_ = 0.5 - bias.m_data[1];
  auVar34._8_4_ = 1.0 - bias.m_data[2];
  auVar34._12_4_ = 0.5 - bias.m_data[0];
  local_3a4 = (1.0 - bias.m_data[0]) / scale.m_data[0];
  auVar23._8_4_ = scale.m_data[2];
  auVar23._12_4_ = scale.m_data[0];
  _local_3c8 = divps(auVar34,auVar23);
  auVar24._0_4_ = 1.0 - bias.m_data[1];
  auVar24._4_4_ = 0.5 - bias.m_data[2];
  auVar24._8_8_ = 0;
  auVar25._8_8_ = 0;
  auVar25 = divps(auVar24,auVar25);
  local_3b8._M_allocated_capacity = auVar25._0_8_;
  local_3a0 = local_3c8._4_4_;
  local_3b8._8_4_ = local_3c8._12_4_;
  local_3b8._12_4_ = (0.0 - bias.m_data[1]) / scale.m_data[1];
  local_3a8 = auVar25._4_4_;
  local_39c = (0.0 - bias.m_data[2]) / scale.m_data[2];
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_410;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1,"a_coords = ",0xb);
  lVar18 = 0;
  triB[0].m_data[2] = 0.0;
  triB[0].m_data[0] = 0.0;
  triB[0].m_data[1] = 0.0;
  res_4.m_data[0] = 0.0;
  res_4.m_data[1] = 0.0;
  res_4.m_data[2] = 0.0;
  do {
    res_4.m_data[lVar18] = triB[0].m_data[lVar18] - bias.m_data[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  res_5.m_data[2] = 0.0;
  res_5.m_data[0] = 0.0;
  res_5.m_data[1] = 0.0;
  lVar18 = 0;
  do {
    res_5.m_data[lVar18] = res_4.m_data[lVar18] / scale.m_data[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  tcu::operator<<((ostream *)ppbVar1,&res_5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1," -> ",4);
  reference.m_width = 0x3f800000;
  reference.m_height = 0x3f800000;
  reference.m_pixels.m_ptr._0_4_ = 0x3f800000;
  rendered.m_width = 0;
  rendered.m_height = 0;
  rendered.m_pixels.m_ptr._0_4_ = 0;
  lVar18 = 0;
  do {
    (&rendered.m_width)[lVar18] = (int)((float)(&reference.m_width)[lVar18] - bias.m_data[lVar18]);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  res_7.m_data[2] = 0.0;
  res_7.m_data[0] = 0.0;
  res_7.m_data[1] = 0.0;
  lVar18 = 0;
  do {
    res_7.m_data[lVar18] = (float)(&rendered.m_width)[lVar18] / scale.m_data[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  tcu::operator<<((ostream *)ppbVar1,&res_7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar1);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_410;
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1,"u_scale = ",10);
  tcu::operator<<((ostream *)ppbVar1,&scale);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar1);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_410;
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1,"u_bias = ",9);
  tcu::operator<<((ostream *)ppbVar1,&bias);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar1);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  PVar2 = this->m_precision;
  uVar14 = 0;
  bVar20 = false;
  do {
    bVar6 = isValidFloat(PVar2,scale.m_data[uVar14]);
    if (!bVar6) break;
    bVar20 = 1 < uVar14;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 3);
  if (bVar20) {
    PVar2 = this->m_precision;
    uVar14 = 0;
    bVar20 = false;
    do {
      bVar6 = isValidFloat(PVar2,bias.m_data[uVar14]);
      if (!bVar6) break;
      bVar20 = 1 < uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 3);
    if (bVar20) {
      uVar14 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar14;
        bVar20 = isValidFloat(this->m_precision,*(float *)(local_3c8 + uVar14 * 4));
        if (!bVar20) {
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,(char *)0x0,"isValidFloat(m_precision, coords[ndx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
                     ,0xed);
LAB_01062f6e:
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar19 = SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
        bVar20 = isValidFloat(this->m_precision,
                              *(float *)(local_3c8 + uVar14 * 4) *
                              *(float *)((long)&scale + uVar14 * 4 + uVar19 * -3) +
                              *(float *)((long)&bias + uVar14 * 4 + uVar19 * -3));
        if (!bVar20) {
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,(char *)0x0,
                     "isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
                     ,0xee);
          goto LAB_01062f6e;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0xc);
      index = glwGetAttribLocation(program.m_program.m_program,"a_position");
      index_00 = glwGetAttribLocation(program.m_program.m_program,"a_coords");
      glwEnableVertexAttribArray(index);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,positions);
      glwEnableVertexAttribArray(index_00);
      glwVertexAttribPointer(index_00,3,0x1406,'\0',0,local_3c8);
      glwUseProgram(program.m_program.m_program);
      GVar8 = glwGetUniformLocation(program.m_program.m_program,"u_scale");
      glwUniform3f(GVar8,scale.m_data[0],scale.m_data[1],scale.m_data[2]);
      GVar8 = glwGetUniformLocation(program.m_program.m_program,"u_bias");
      glwUniform3f(GVar8,bias.m_data[0],bias.m_data[1],bias.m_data[2]);
      err = glwGetError();
      glu::checkError(err,"After program setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
                      ,0x103);
      tcu::Surface::Surface(&rendered,0x80,0x80);
      tcu::Surface::Surface(&reference,0x80,0x80);
      glwViewport(x,y,0x80,0x80);
      glwDrawElements(4,6,0x1403,iterate::indices);
      pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
      tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&sources,&reference,&pRVar9->m_pixelFormat)
      ;
      res_5.m_data[1] = fStack_3bc;
      res_5.m_data[0] = (float)local_3c8._0_4_;
      res_5.m_data[2] = (float)local_3b8._8_4_;
      local_428._M_allocated_capacity._0_4_ = local_3b8._8_4_;
      local_428._M_allocated_capacity._4_4_ = fStack_3bc;
      res_4.m_data[1] = (float)local_3b8._M_allocated_capacity._0_4_;
      res_4.m_data[0] = (float)local_3c8._4_4_;
      res_4.m_data[2] = (float)local_3b8._12_4_;
      local_3d8._M_allocated_capacity._0_4_ = local_3b8._12_4_;
      local_3d8._M_allocated_capacity._4_4_ = local_3b8._M_allocated_capacity._0_4_;
      triB[0].m_data[1] = (float)local_3b8._M_allocated_capacity._4_4_;
      triB[0].m_data[0] = fStack_3c0;
      triB[0].m_data[2] = local_3a8;
      triB[1].m_data[0] = local_39c;
      triB[1].m_data[1] = local_3a8;
      triB[1].m_data[2] = (float)local_3b8._M_allocated_capacity._4_4_;
      res_7.m_data[1] = fVar36;
      res_7.m_data[0] = fVar21;
      res_7.m_data[2] = fVar35;
      local_3f8._M_allocated_capacity._0_4_ = fVar35;
      local_3f8._M_allocated_capacity._4_4_ = fVar36;
      if (0 < (int)sources.sources[1].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
        iVar15 = 0;
        do {
          if (0 < sources.sources[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            fVar35 = ((float)iVar15 + 0.5) /
                     (float)(int)sources.sources[1].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
            sVar4 = (sources.sources[0].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
            iVar16 = 0;
            do {
              fVar21 = ((float)iVar16 + 0.5) /
                       (float)sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              bVar20 = 1.0 <= fVar35 + fVar21;
              uVar30 = (uint)bVar20;
              lVar18 = (ulong)(uVar30 * 4) * 3;
              fVar36 = *(float *)((long)res_7.m_data + lVar18);
              uVar28 = (int)(uVar30 << 0x1f) >> 0x1f;
              uVar30 = (int)(uVar30 << 0x1f) >> 0x1f;
              fVar29 = (float)(~uVar28 & (uint)fVar35 | (uint)(1.0 - fVar35) & uVar28);
              fVar31 = (float)(~uVar30 & (uint)fVar21 | (uint)(1.0 - fVar21) & uVar30);
              fVar37 = (1.0 - fVar31) - fVar29;
              uVar14 = *(ulong *)((long)res_7.m_data + lVar18 + 4);
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar14;
              fVar22 = (float)uVar14;
              fVar27 = (float)(uVar14 >> 0x20);
              fVar21 = fVar31 / fVar27 + fVar29 / fVar22 + fVar37 / fVar36;
              uVar30 = 0xff000000;
              if (((uint)sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
                auVar33._0_4_ = (float)*(undefined8 *)((&res_5)[bVar20].m_data + 1) * fVar29;
                auVar33._4_4_ =
                     (float)((ulong)*(undefined8 *)((&res_5)[bVar20].m_data + 1) >> 0x20) * fVar31;
                auVar33._8_4_ = in_XMM7_Dc * 0.0;
                auVar33._12_4_ = in_XMM7_Dd * 0.0;
                auVar25 = divps(auVar33,auVar26);
                fVar32 = ((auVar25._4_4_ +
                          ((&res_5)[bVar20].m_data[0] * fVar37) / fVar36 + auVar25._0_4_) / fVar21)
                         * scale.m_data[0] + bias.m_data[0];
                uVar28 = 0x7e - ((int)fVar32 >> 0x17);
                uVar30 = (((uint)fVar32 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar28 & 0x1f)) +
                         0x800000;
                if (8 < uVar28) {
                  uVar30 = uVar28;
                }
                uVar30 = uVar30 >> 0x18 | 0xff000000;
              }
              uVar28 = 0;
              uVar17 = 0;
              if (((uint)sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 2) != 0) {
                fVar32 = (((*(float *)((long)res_4.m_data + lVar18 + 8) * fVar31) / fVar27 +
                          (*(float *)((long)res_4.m_data + lVar18 + 4) * fVar29) / fVar22 +
                          (*(float *)((long)res_4.m_data + lVar18) * fVar37) / fVar36) / fVar21) *
                         scale.m_data[1] + bias.m_data[1];
                uVar12 = 0x7e - ((int)fVar32 >> 0x17);
                uVar17 = (((uint)fVar32 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
                         0x800000;
                if (8 < uVar12) {
                  uVar17 = uVar12;
                }
                uVar17 = uVar17 >> 0x10 & 0xff00;
              }
              if (((uint)sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 4) != 0) {
                fVar36 = (((fVar31 * *(float *)((long)triB[0].m_data + lVar18 + 8)) / fVar27 +
                          (fVar29 * *(float *)((long)triB[0].m_data + lVar18 + 4)) / fVar22 +
                          (fVar37 * *(float *)((long)triB[0].m_data + lVar18)) / fVar36) / fVar21) *
                         scale.m_data[2] + bias.m_data[2];
                uVar12 = 0x7e - ((int)fVar36 >> 0x17);
                uVar28 = (((uint)fVar36 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
                         0x800000;
                if (8 < uVar12) {
                  uVar28 = uVar12;
                }
                uVar28 = uVar28 >> 8 & 0xff0000;
              }
              *(uint *)(sVar4 + (long)(sources.sources[0].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_ + iVar16 +
                                      ((int)sources.sources[0].
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      iVar15) * *(int *)&((sources.sources[0].
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p) * 4) = uVar17 | uVar30 | uVar28
              ;
              iVar16 = iVar16 + 1;
            } while (iVar16 < sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < (int)sources.sources[1].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
      res_5.m_data[0] = 1.12104e-44;
      res_5.m_data[1] = 4.2039e-45;
      if (rendered.m_pixels.m_cap != 0) {
        rendered.m_pixels.m_cap =
             CONCAT44(rendered.m_pixels.m_ptr._4_4_,rendered.m_pixels.m_ptr._0_4_);
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&sources,(TextureFormat *)&res_5,rendered.m_width,
                 rendered.m_height,1,(void *)rendered.m_pixels.m_cap);
      glu::readPixels(pRVar3,x,y,(PixelBufferAccess *)&sources);
      iVar15 = tcu::measurePixelDiffAccuracy
                         ((TestLog *)local_410,"Result","Image comparison result",&reference,
                          &rendered,0x10,300,COMPARE_LOG_EVERYTHING);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
      std::ostream::operator<<(&sources,iVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
      std::ios_base::~ios_base
                ((ios_base *)
                 &sources.sources[4].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)res_5.m_data._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res_5.m_data._0_8_ != &local_428) {
        operator_delete((void *)res_5.m_data._0_8_,
                        CONCAT44(local_428._M_allocated_capacity._4_4_,
                                 local_428._M_allocated_capacity._0_4_) + 1);
      }
      tcu::Surface::~Surface(&reference);
      tcu::Surface::~Surface(&rendered);
      goto LAB_01062ee8;
    }
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,(char *)0x0,"isValidFloatVec(m_precision, bias)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
               ,0xea);
  }
  else {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,(char *)0x0,"isValidFloatVec(m_precision, scale)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
               ,0xe9);
  }
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

InterpolationCase::IterateResult InterpolationCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	int							viewportWidth	= 128;
	int							viewportHeight	= 128;

	if (renderTarget.getWidth() < viewportWidth ||
		renderTarget.getHeight() < viewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportWidth);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportHeight);

	static const char* s_vertShaderTemplate =
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in ${PRECISION} vec3 a_coords;\n"
		"out ${PRECISION} vec3 v_coords;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";
	static const char* s_fragShaderTemplate =
		"#version 300 es\n"
		"in ${PRECISION} vec3 v_coords;\n"
		"uniform ${PRECISION} vec3 u_scale;\n"
		"uniform ${PRECISION} vec3 u_bias;\n"
		"layout(location = 0) out ${PRECISION} vec4 o_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	o_color = vec4(v_coords * u_scale + u_bias, 1.0);\n"
		"}\n";

	map<string, string> templateParams;
	templateParams["PRECISION"] = glu::getPrecisionName(m_precision);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(tcu::StringTemplate(s_vertShaderTemplate).specialize(templateParams),
													   tcu::StringTemplate(s_fragShaderTemplate).specialize(templateParams)));
	log << program;
	if (!program.isOk())
	{
		if (m_precision == glu::PRECISION_HIGHP && !m_context.getContextInfo().isFragmentHighPrecisionSupported())
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Fragment highp not supported");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Position coordinates.
	Vec4 wCoord = m_projective ? Vec4(1.3f, 0.8f, 0.6f, 2.0f) : Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	float positions[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};

	// Coordinates for interpolation.
	tcu::Vec3 scale	= 1.0f / (m_max - m_min);
	tcu::Vec3 bias	= -1.0f*m_min*scale;
	float coords[] =
	{
		(0.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (1.0f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (1.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (0.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(1.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (0.0f - bias[2])/scale[2]
	};

	log << TestLog::Message << "a_coords = " << ((tcu::Vec3(0.0f) - bias)/scale) << " -> " << ((tcu::Vec3(1.0f) - bias)/scale) << TestLog::EndMessage;
	log << TestLog::Message << "u_scale = " << scale << TestLog::EndMessage;
	log << TestLog::Message << "u_bias = " << bias << TestLog::EndMessage;

	// Verify that none of the inputs are denormalized / inf / nan.
	TCU_CHECK(isValidFloatVec(m_precision, scale));
	TCU_CHECK(isValidFloatVec(m_precision, bias));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(coords); ndx++)
	{
		TCU_CHECK(isValidFloat(m_precision, coords[ndx]));
		TCU_CHECK(isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3]));
	}

	// Indices.
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	{
		const int	posLoc		= glGetAttribLocation(program.getProgram(), "a_position");
		const int	coordLoc	= glGetAttribLocation(program.getProgram(), "a_coords");

		glEnableVertexAttribArray(posLoc);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);

		glEnableVertexAttribArray(coordLoc);
		glVertexAttribPointer(coordLoc, 3, GL_FLOAT, GL_FALSE, 0, &coords[0]);
	}

	glUseProgram(program.getProgram());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_scale"), scale.x(), scale.y(), scale.z());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_bias"), bias.x(), bias.y(), bias.z());

	GLU_CHECK_MSG("After program setup");

	// Frames.
	tcu::Surface	rendered		(viewportWidth, viewportHeight);
	tcu::Surface	reference		(viewportWidth, viewportHeight);

	// Render with GL.
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	// Render reference \note While GPU is hopefully doing our draw call.
	renderReference(SurfaceAccess(reference, m_context.getRenderTarget().getPixelFormat()), coords, wCoord, scale, bias);

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, rendered.getAccess());

	// Compute difference.
	const int		bestScoreDiff	= 16;
	const int		worstScoreDiff	= 300;
	int				score			= tcu::measurePixelDiffAccuracy(log, "Result", "Image comparison result", reference, rendered, bestScoreDiff, worstScoreDiff, tcu::COMPARE_LOG_EVERYTHING);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	return STOP;
}